

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_renumber.cc
# Opt level: O1

bool compare(QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  const_iterator cVar7;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  ostream *poVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_a;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_b;
  key_type local_d0;
  key_type local_c8;
  _Base_ptr local_c0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long local_a8;
  long *local_a0;
  key_type local_98;
  long local_90;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  long local_78;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (compare(QPDFObjectHandle,QPDFObjectHandle)::visited == '\0') {
    compare();
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    local_d0 = (key_type)QPDFObjectHandle::getObjGen();
    cVar7 = std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::find(&compare::visited._M_t,&local_d0);
    if ((_Rb_tree_header *)cVar7._M_node != &compare::visited._M_t._M_impl.super__Rb_tree_header) {
      return true;
    }
    local_d0 = (key_type)QPDFObjectHandle::getObjGen();
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::_M_insert_unique<QPDFObjGen>(&compare::visited._M_t,&local_d0);
  }
  iVar4 = QPDFObjectHandle::getTypeCode();
  iVar5 = QPDFObjectHandle::getTypeCode();
  if (iVar4 != iVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"different type code",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    goto LAB_00103da2;
  }
  uVar6 = QPDFObjectHandle::getTypeCode();
  bVar3 = true;
  switch(uVar6) {
  case 2:
    goto switchD_001037ad_caseD_2;
  case 3:
    cVar1 = QPDFObjectHandle::getBoolValue();
    cVar2 = QPDFObjectHandle::getBoolValue();
    if (cVar1 == cVar2) {
      return true;
    }
    pcVar10 = "different boolean";
    goto LAB_0010389e;
  case 4:
    lVar11 = QPDFObjectHandle::getIntValue();
    lVar12 = QPDFObjectHandle::getIntValue();
    if (lVar11 == lVar12) {
      return true;
    }
    pcVar10 = "different integer";
LAB_0010389e:
    lVar11 = 0x11;
LAB_00103d58:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,lVar11);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    break;
  case 5:
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    bVar3 = true;
    if (local_c8 == local_98) {
      if (local_c8 == (key_type)0x0) {
        bVar3 = false;
      }
      else {
        iVar4 = bcmp((void *)local_d0,local_a0,(size_t)local_c8);
        bVar3 = iVar4 != 0;
      }
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_d0 != (key_type)&local_c0) {
      operator_delete((void *)local_d0,(ulong)((long)&local_c0->_M_color + 1));
    }
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different real";
    goto LAB_00103d53;
  case 6:
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar3 = true;
    if (local_c8 == local_98) {
      if (local_c8 == (key_type)0x0) {
        bVar3 = false;
      }
      else {
        iVar4 = bcmp((void *)local_d0,local_a0,(size_t)local_c8);
        bVar3 = iVar4 != 0;
      }
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_d0 != (key_type)&local_c0) {
      operator_delete((void *)local_d0,(ulong)((long)&local_c0->_M_color + 1));
    }
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different string";
    lVar11 = 0x10;
    goto LAB_00103d58;
  case 7:
    QPDFObjectHandle::getName_abi_cxx11_();
    QPDFObjectHandle::getName_abi_cxx11_();
    bVar3 = true;
    if (local_c8 == local_98) {
      if (local_c8 == (key_type)0x0) {
        bVar3 = false;
      }
      else {
        iVar4 = bcmp((void *)local_d0,local_a0,(size_t)local_c8);
        bVar3 = iVar4 != 0;
      }
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_d0 != (key_type)&local_c0) {
      operator_delete((void *)local_d0,(ulong)((long)&local_c0->_M_color + 1));
    }
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different name";
LAB_00103d53:
    lVar11 = 0xe;
    goto LAB_00103d58;
  case 8:
    QPDFObjectHandle::getArrayAsVector();
    QPDFObjectHandle::getArrayAsVector();
    if ((long)local_c8 - (long)local_d0 == (long)local_98 - (long)local_a0) {
      if (local_c8 != local_d0) {
        lVar11 = (long)local_c8 - (long)local_d0 >> 4;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        lVar12 = 8;
        do {
          local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)((long)((long)local_d0 + -8) + lVar12);
          local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_d0 + lVar12);
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_60.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_60.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
            }
          }
          local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)((long)local_a0 + lVar12 + -8);
          local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a0 + lVar12);
          if (local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_70.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_70.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
            }
          }
          bVar3 = compare(&local_60,&local_70);
          if (local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (!bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"different array item",0x14);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_00103d8e;
          }
          lVar12 = lVar12 + 0x10;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_a0);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_d0);
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"different array size",0x14);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00103d8e:
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_a0);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_d0);
    break;
  case 9:
    QPDFObjectHandle::getKeys_abi_cxx11_();
    QPDFObjectHandle::getKeys_abi_cxx11_();
    if (local_a8 == local_78) {
      bVar3 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        (local_b8,(_Base_ptr)&local_c8,local_88);
      if (bVar3) {
        _Var8._M_node = local_b8._M_node;
        if (local_b8._M_node != (_Base_ptr)&local_c8) {
          do {
            QPDFObjectHandle::getKey((string *)&local_50);
            QPDFObjectHandle::getKey(local_40);
            bVar3 = compare(&local_50,(QPDFObjectHandle *)local_40);
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
            if (local_50.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_50.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"different dictionary item",0x19);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
              std::ostream::put('\x10');
              std::ostream::flush();
              if (!bVar3) goto LAB_00103c16;
            }
            _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
          } while (_Var8._M_node != (_Rb_tree_node_base *)&local_c8);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0);
        return true;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"different dictionary keys",0x19);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00103c16:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d0);
    break;
  case 10:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"stream objects are not compared",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    return true;
  default:
    poVar9 = std::operator<<((ostream *)&std::cerr,"unknown object type");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(2);
  }
LAB_00103da2:
  bVar3 = false;
switchD_001037ad_caseD_2:
  return bVar3;
}

Assistant:

bool
compare(QPDFObjectHandle a, QPDFObjectHandle b)
{
    static std::set<QPDFObjGen> visited;
    if (a.isIndirect()) {
        if (visited.count(a.getObjGen())) {
            return true;
        }
        visited.insert(a.getObjGen());
    }

    if (a.getTypeCode() != b.getTypeCode()) {
        std::cerr << "different type code" << std::endl;
        return false;
    }

    switch (a.getTypeCode()) {
    case ::ot_boolean:
        if (a.getBoolValue() != b.getBoolValue()) {
            std::cerr << "different boolean" << std::endl;
            return false;
        }
        break;
    case ::ot_integer:
        if (a.getIntValue() != b.getIntValue()) {
            std::cerr << "different integer" << std::endl;
            return false;
        }
        break;
    case ::ot_real:
        if (a.getRealValue() != b.getRealValue()) {
            std::cerr << "different real" << std::endl;
            return false;
        }
        break;
    case ::ot_string:
        if (a.getStringValue() != b.getStringValue()) {
            std::cerr << "different string" << std::endl;
            return false;
        }
        break;
    case ::ot_name:
        if (a.getName() != b.getName()) {
            std::cerr << "different name" << std::endl;
            return false;
        }
        break;
    case ::ot_array:
        {
            std::vector<QPDFObjectHandle> objs_a = a.getArrayAsVector();
            std::vector<QPDFObjectHandle> objs_b = b.getArrayAsVector();
            size_t items = objs_a.size();
            if (items != objs_b.size()) {
                std::cerr << "different array size" << std::endl;
                return false;
            }

            for (size_t i = 0; i < items; ++i) {
                if (!compare(objs_a[i], objs_b[i])) {
                    std::cerr << "different array item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_dictionary:
        {
            std::set<std::string> keys_a = a.getKeys();
            std::set<std::string> keys_b = b.getKeys();
            if (keys_a != keys_b) {
                std::cerr << "different dictionary keys" << std::endl;
                return false;
            }

            for (auto const& key: keys_a) {
                if (!compare(a.getKey(key), b.getKey(key))) {
                    std::cerr << "different dictionary item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_null:
        break;
    case ::ot_stream:
        std::cout << "stream objects are not compared" << std::endl;
        break;
    default:
        std::cerr << "unknown object type" << std::endl;
        std::exit(2);
    }

    return true;
}